

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

string * duckdb::CastExceptionText<duckdb::date_t,_duckdb::timestamp_ns_t>(date_t input)

{
  bool bVar1;
  undefined4 in_ESI;
  string *in_RDI;
  date_t in_stack_fffffffffffffdec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  string asStack_1f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  string asStack_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1a8;
  string asStack_188 [32];
  string asStack_168 [32];
  string asStack_148 [32];
  string asStack_128 [7];
  PhysicalType in_stack_fffffffffffffedf;
  string asStack_108 [36];
  undefined4 uStack_e4;
  string asStack_e0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b0;
  string asStack_90 [32];
  string asStack_70 [32];
  string asStack_50 [32];
  string asStack_30 [36];
  undefined4 uStack_c;
  
  uStack_c = in_ESI;
  bVar1 = TypeIsNumber<duckdb::date_t>();
  if ((bVar1) && (bVar1 = TypeIsNumber<duckdb::timestamp_ns_t>(), bVar1)) {
    GetTypeId<duckdb::date_t>();
    pbVar2 = &bStack_b0;
    TypeIdToString(in_stack_fffffffffffffedf);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((char *)pbVar2,in_stack_fffffffffffffdf0);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbVar2,(char *)in_stack_fffffffffffffdf0);
    uStack_e4 = uStack_c;
    ConvertToString::Operation<duckdb::date_t>(in_stack_fffffffffffffdec);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbVar2,(char *)in_stack_fffffffffffffdf0);
    GetTypeId<duckdb::timestamp_ns_t>();
    TypeIdToString(in_stack_fffffffffffffedf);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ::std::__cxx11::string::~string(asStack_108);
    ::std::__cxx11::string::~string(asStack_30);
    ::std::__cxx11::string::~string(asStack_50);
    ::std::__cxx11::string::~string(asStack_e0);
    ::std::__cxx11::string::~string(asStack_70);
    ::std::__cxx11::string::~string(asStack_90);
    ::std::__cxx11::string::~string((string *)&bStack_b0);
  }
  else {
    GetTypeId<duckdb::date_t>();
    pbVar2 = &bStack_1a8;
    TypeIdToString(in_stack_fffffffffffffedf);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((char *)in_stack_fffffffffffffdf8,pbVar2);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffdf8,(char *)pbVar2);
    ConvertToString::Operation<duckdb::date_t>(in_stack_fffffffffffffdec);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffdf8,(char *)pbVar2);
    GetTypeId<duckdb::timestamp_ns_t>();
    TypeIdToString(in_stack_fffffffffffffedf);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    ::std::__cxx11::string::~string(asStack_1f0);
    ::std::__cxx11::string::~string(asStack_128);
    ::std::__cxx11::string::~string(asStack_148);
    ::std::__cxx11::string::~string(asStack_1c8);
    ::std::__cxx11::string::~string(asStack_168);
    ::std::__cxx11::string::~string(asStack_188);
    ::std::__cxx11::string::~string((string *)&bStack_1a8);
  }
  return in_RDI;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}